

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  char *local_5b8;
  bool local_523;
  byte local_501;
  allocator local_4c1;
  string local_4c0;
  allocator local_499;
  string local_498;
  string local_478;
  string local_458;
  ostringstream local_438 [8];
  ostringstream msg;
  allocator local_2b9;
  string local_2b8;
  byte local_293;
  byte local_292;
  allocator local_291;
  string local_290;
  byte local_26b;
  byte local_26a;
  allocator local_269;
  string local_268;
  byte local_243;
  byte local_242;
  allocator local_241;
  string local_240;
  byte local_21b;
  byte local_21a;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  char *local_1d0;
  char *value;
  ostringstream local_198 [8];
  ostringstream ostr;
  char *var_local;
  cmCommandArgumentParserHelper *this_local;
  
  if (var == (char *)0x0) {
    this_local = (cmCommandArgumentParserHelper *)0x0;
  }
  else if ((this->FileLine < 0) || (iVar5 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar5 != 0)) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f0,var,&local_1f1);
    local_5b8 = cmMakefile::GetDefinition(pcVar1,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    local_1d0 = local_5b8;
    if ((local_5b8 == (char *)0x0) && ((this->RemoveEmpty & 1U) == 0)) {
      local_21a = 0;
      local_21b = 0;
      local_501 = 0;
      if ((this->WarnUninitialized & 1U) != 0) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        local_21a = 1;
        std::__cxx11::string::string((string *)&local_218,var,&local_219);
        local_21b = 1;
        bVar3 = cmMakefile::VariableInitialized(pcVar1,&local_218);
        local_501 = bVar3 ^ 0xff;
      }
      if ((local_21b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_218);
      }
      if ((local_21a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
      }
      if ((local_501 & 1) != 0) {
        local_242 = 0;
        local_243 = 0;
        local_26a = 0;
        local_26b = 0;
        local_292 = 0;
        local_293 = 0;
        bVar2 = false;
        bVar3 = false;
        local_523 = true;
        if ((this->CheckSystemVars & 1U) == 0) {
          pcVar6 = this->FileName;
          std::allocator<char>::allocator();
          local_242 = 1;
          std::__cxx11::string::string((string *)&local_240,pcVar6,&local_241);
          local_243 = 1;
          pcVar6 = cmMakefile::GetHomeDirectory(this->Makefile);
          std::allocator<char>::allocator();
          local_26a = 1;
          std::__cxx11::string::string((string *)&local_268,pcVar6,&local_269);
          local_26b = 1;
          bVar4 = cmsys::SystemTools::IsSubDirectory(&local_240,&local_268);
          local_523 = true;
          if (!bVar4) {
            pcVar6 = this->FileName;
            std::allocator<char>::allocator();
            local_292 = 1;
            std::__cxx11::string::string((string *)&local_290,pcVar6,&local_291);
            local_293 = 1;
            pcVar6 = cmMakefile::GetHomeOutputDirectory(this->Makefile);
            std::allocator<char>::allocator();
            bVar2 = true;
            std::__cxx11::string::string((string *)&local_2b8,pcVar6,&local_2b9);
            bVar3 = true;
            local_523 = cmsys::SystemTools::IsSubDirectory(&local_290,&local_2b8);
          }
        }
        if (bVar3) {
          std::__cxx11::string::~string((string *)&local_2b8);
        }
        if (bVar2) {
          std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
        }
        if ((local_293 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_290);
        }
        if ((local_292 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_291);
        }
        if ((local_26b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_268);
        }
        if ((local_26a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_269);
        }
        if ((local_243 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_240);
        }
        if ((local_242 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_241);
        }
        if (local_523 != false) {
          std::__cxx11::ostringstream::ostringstream(local_438);
          poVar7 = std::operator<<((ostream *)local_438,"uninitialized variable \'");
          poVar7 = std::operator<<(poVar7,var);
          std::operator<<(poVar7,"\'");
          pcVar1 = this->Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_458);
          std::__cxx11::string::~string((string *)&local_458);
          std::__cxx11::ostringstream::~ostringstream(local_438);
        }
      }
      this_local = (cmCommandArgumentParserHelper *)0x0;
    }
    else if (((this->EscapeQuotes & 1U) == 0) || (local_5b8 == (char *)0x0)) {
      if (local_5b8 == (char *)0x0) {
        local_5b8 = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4c0,local_5b8,&local_4c1);
      this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_4c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_498,local_5b8,&local_499);
      cmSystemTools::EscapeQuotes(&local_478,&local_498);
      this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_478);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator((allocator<char> *)&local_499);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::ostream::operator<<(local_198,this->FileLine);
    std::__cxx11::ostringstream::str();
    this_local = (cmCommandArgumentParserHelper *)AddString(this,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return this_local->EmptyVariable;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if (!var) {
    return CM_NULLPTR;
  }
  if (this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0) {
    std::ostringstream ostr;
    ostr << this->FileLine;
    return this->AddString(ostr.str());
  }
  const char* value = this->Makefile->GetDefinition(var);
  if (!value && !this->RemoveEmpty) {
    // check to see if we need to print a warning
    // if strict mode is on and the variable has
    // not been "cleared"/initialized with a set(foo ) call
    if (this->WarnUninitialized && !this->Makefile->VariableInitialized(var)) {
      if (this->CheckSystemVars ||
          cmSystemTools::IsSubDirectory(this->FileName,
                                        this->Makefile->GetHomeDirectory()) ||
          cmSystemTools::IsSubDirectory(
            this->FileName, this->Makefile->GetHomeOutputDirectory())) {
        std::ostringstream msg;
        msg << "uninitialized variable \'" << var << "\'";
        this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, msg.str());
      }
    }
    return CM_NULLPTR;
  }
  if (this->EscapeQuotes && value) {
    return this->AddString(cmSystemTools::EscapeQuotes(value));
  }
  return this->AddString(value ? value : "");
}